

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgload.c
# Opt level: O2

FT_Error TT_Access_Glyph_Frame
                   (TT_Loader loader,FT_UInt glyph_index,FT_ULong offset,FT_UInt byte_count)

{
  FT_Stream stream;
  uchar *puVar1;
  FT_Error FVar2;
  
  stream = loader->stream;
  FVar2 = FT_Stream_Seek(stream,offset);
  if (FVar2 == 0) {
    FVar2 = FT_Stream_EnterFrame(stream,(ulong)byte_count);
    if (FVar2 == 0) {
      puVar1 = stream->limit;
      loader->cursor = stream->cursor;
      loader->limit = puVar1;
      FVar2 = 0;
    }
  }
  return FVar2;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  TT_Access_Glyph_Frame( TT_Loader  loader,
                         FT_UInt    glyph_index,
                         FT_ULong   offset,
                         FT_UInt    byte_count )
  {
    FT_Error   error;
    FT_Stream  stream = loader->stream;

    FT_UNUSED( glyph_index );


    /* the following line sets the `error' variable through macros! */
    if ( FT_STREAM_SEEK( offset ) || FT_FRAME_ENTER( byte_count ) )
      return error;

    loader->cursor = stream->cursor;
    loader->limit  = stream->limit;

    return FT_Err_Ok;
  }